

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O0

void Abc_ManTimeExpand(Abc_ManTime_t *p,int nSize,int fProgressive)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  undefined4 *puVar3;
  int iVar4;
  void *local_68;
  void *local_60;
  void *local_58;
  void *local_50;
  int local_48;
  int local_44;
  int local_40;
  int i;
  int nSizeNew;
  int nSizeOld;
  Abc_Time_t *pTime;
  Abc_Time_t *ppTimesOld;
  Abc_Time_t *ppTimes;
  Vec_Ptr_t *vTimes;
  int fProgressive_local;
  int nSize_local;
  Abc_ManTime_t *p_local;
  
  iVar1 = p->vArrs->nSize;
  if (iVar1 < nSize) {
    local_48 = nSize;
    if (fProgressive != 0) {
      local_48 = nSize << 1;
    }
    local_40 = local_48;
    if (local_48 < 100) {
      local_40 = 100;
    }
    pVVar2 = p->vArrs;
    Vec_PtrGrow(pVVar2,local_40);
    pVVar2->nSize = local_40;
    if (iVar1 == 0) {
      local_50 = (void *)0x0;
    }
    else {
      local_50 = *pVVar2->pArray;
    }
    if (local_50 == (void *)0x0) {
      local_58 = malloc((long)local_40 << 3);
    }
    else {
      local_58 = realloc(local_50,(long)local_40 << 3);
    }
    for (local_44 = 0; iVar4 = iVar1, local_44 < local_40; local_44 = local_44 + 1) {
      pVVar2->pArray[local_44] = (void *)((long)local_58 + (long)local_44 * 8);
    }
    while (local_44 = iVar4, local_44 < local_40) {
      puVar3 = (undefined4 *)pVVar2->pArray[local_44];
      *puVar3 = 0xce6e6b28;
      puVar3[1] = 0xce6e6b28;
      iVar4 = local_44 + 1;
    }
    pVVar2 = p->vReqs;
    Vec_PtrGrow(pVVar2,local_40);
    pVVar2->nSize = local_40;
    if (iVar1 == 0) {
      local_60 = (void *)0x0;
    }
    else {
      local_60 = *pVVar2->pArray;
    }
    if (local_60 == (void *)0x0) {
      local_68 = malloc((long)local_40 << 3);
    }
    else {
      local_68 = realloc(local_60,(long)local_40 << 3);
    }
    for (local_44 = 0; local_44 < local_40; local_44 = local_44 + 1) {
      pVVar2->pArray[local_44] = (void *)((long)local_68 + (long)local_44 * 8);
    }
    while (local_44 = iVar1, local_44 < local_40) {
      puVar3 = (undefined4 *)pVVar2->pArray[local_44];
      *puVar3 = 0x4e6e6b28;
      puVar3[1] = 0x4e6e6b28;
      iVar1 = local_44 + 1;
    }
  }
  return;
}

Assistant:

void Abc_ManTimeExpand( Abc_ManTime_t * p, int nSize, int fProgressive )
{
    Vec_Ptr_t * vTimes;
    Abc_Time_t * ppTimes, * ppTimesOld, * pTime;
    int nSizeOld, nSizeNew, i;

    nSizeOld = p->vArrs->nSize;
    if ( nSizeOld >= nSize )
        return;
    nSizeNew = fProgressive? 2 * nSize : nSize;
    if ( nSizeNew < 100 )
        nSizeNew = 100;

    vTimes = p->vArrs;
    Vec_PtrGrow( vTimes, nSizeNew );
    vTimes->nSize = nSizeNew;
    ppTimesOld = ( nSizeOld == 0 )? NULL : (Abc_Time_t *)vTimes->pArray[0];
    ppTimes = ABC_REALLOC( Abc_Time_t, ppTimesOld, nSizeNew );
    for ( i = 0; i < nSizeNew; i++ )
        vTimes->pArray[i] = ppTimes + i;
    for ( i = nSizeOld; i < nSizeNew; i++ )
    {
        pTime = (Abc_Time_t *)vTimes->pArray[i];
        pTime->Rise  = -ABC_INFINITY;
        pTime->Fall  = -ABC_INFINITY;
    }

    vTimes = p->vReqs;
    Vec_PtrGrow( vTimes, nSizeNew );
    vTimes->nSize = nSizeNew;
    ppTimesOld = ( nSizeOld == 0 )? NULL : (Abc_Time_t *)vTimes->pArray[0];
    ppTimes = ABC_REALLOC( Abc_Time_t, ppTimesOld, nSizeNew );
    for ( i = 0; i < nSizeNew; i++ )
        vTimes->pArray[i] = ppTimes + i;
    for ( i = nSizeOld; i < nSizeNew; i++ )
    {
        pTime = (Abc_Time_t *)vTimes->pArray[i];
        pTime->Rise  = ABC_INFINITY;
        pTime->Fall  = ABC_INFINITY;
    }
}